

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLStringOperation
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,char *pIn
              ,char **ppOut)

{
  int iVar1;
  XExtDisplayInfo *info_00;
  size_t sVar2;
  char *pcVar3;
  int slop;
  int length;
  int outSize;
  int inSize;
  int ret;
  xnvCtrlStringOperationReply rep;
  xnvCtrlStringOperationReq *req;
  XExtDisplayInfo *info;
  char *pIn_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  attribute_local = target_id;
  display_mask_local = target_type;
  _target_id_local = dpy;
  info_00 = find_display(dpy);
  if ((info_00 == (XExtDisplayInfo *)0x0) || (info_00->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if (ppOut == (char **)0x0) {
    dpy_local._4_4_ = 0;
  }
  else {
    *ppOut = (char *)0x0;
    if ((info_00 == (XExtDisplayInfo *)0x0) || (info_00->codes == (XExtCodes *)0x0)) {
      XMissingExtension(_target_id_local,nvctrl_extension_name);
      dpy_local._4_4_ = 0;
    }
    else {
      XNVCTRLCheckTargetData
                (_target_id_local,info_00,(int *)&display_mask_local,(int *)&attribute_local);
      if (pIn == (char *)0x0) {
        length = 0;
      }
      else {
        sVar2 = strlen(pIn);
        length = (int)sVar2 + 1;
      }
      if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
        (*_target_id_local->lock_fns->lock_display)(_target_id_local);
      }
      rep._24_8_ = _XGetRequest(_target_id_local,0x19,0x14);
      *(char *)rep._24_8_ = (char)info_00->codes->major_opcode;
      *(undefined1 *)(rep._24_8_ + 1) = 0x19;
      *(short *)(rep._24_8_ + 6) = (short)display_mask_local;
      *(short *)(rep._24_8_ + 4) = (short)attribute_local;
      *(uint *)(rep._24_8_ + 8) = display_mask;
      *(uint *)(rep._24_8_ + 0xc) = attribute;
      *(short *)(rep._24_8_ + 2) = *(short *)(rep._24_8_ + 2) + (short)(length + 3 >> 2);
      *(int *)(rep._24_8_ + 0x10) = length;
      if (pIn != (char *)0x0) {
        if (_target_id_local->bufmax < _target_id_local->bufptr + length) {
          _XSend(_target_id_local,pIn,(long)length);
        }
        else {
          memcpy(_target_id_local->bufptr,pIn,(long)length);
          _target_id_local->bufptr = _target_id_local->bufptr + (int)(length + 3U & 0xfffffffc);
        }
      }
      iVar1 = _XReply(_target_id_local,&inSize,0);
      if (iVar1 == 0) {
        if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
          (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
        }
        if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
          (*_target_id_local->synchandler)(_target_id_local);
        }
        dpy_local._4_4_ = 0;
      }
      else {
        if (rep.length != 0) {
          pcVar3 = (char *)malloc((long)(int)rep.length);
          *ppOut = pcVar3;
        }
        if (*ppOut == (char *)0x0) {
          _XEatData(_target_id_local,(long)ret);
        }
        else {
          _XRead(_target_id_local,*ppOut,(long)(int)rep.length);
          if ((rep.length & 3) != 0) {
            _XEatData(_target_id_local,(long)(int)(4 - (rep.length & 3)));
          }
        }
        if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
          (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
        }
        if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
          (*_target_id_local->synchandler)(_target_id_local);
        }
        dpy_local._4_1_ = rep.type;
        dpy_local._5_1_ = rep.padb1;
        dpy_local._6_2_ = rep.sequenceNumber;
      }
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLStringOperation (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char *pIn,
    char **ppOut
) {
    XExtDisplayInfo *info = find_display(dpy);
    xnvCtrlStringOperationReq *req;
    xnvCtrlStringOperationReply rep;
    Bool ret;
    int inSize, outSize, length, slop;

    if (!XextHasExtension(info))
        return False;
    
    if (!ppOut)
        return False;

    *ppOut = NULL;
    
    XNVCTRLCheckExtension(dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);
    
    if (pIn) {
        inSize = strlen(pIn) + 1;
    } else {
        inSize = 0;
    }
    
    LockDisplay(dpy);
    GetReq(nvCtrlStringOperation, req);
    
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlStringOperation;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;

    req->length += ((inSize + 3) & ~3) >> 2;
    req->num_bytes = inSize;
    
    if (pIn) {
        Data(dpy, pIn, inSize);
    }
    
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay(dpy);
        SyncHandle();
        return False;
    }
    
    length = rep.length;
    outSize = rep.num_bytes;
    slop = outSize & 3;

    if (outSize) *ppOut = (char *) Xmalloc(outSize);
    
    if (!*ppOut) {
        _XEatData(dpy, length);
    } else {
        _XRead(dpy, (char *) *ppOut, outSize);
        if (slop) _XEatData(dpy, 4-slop);
    }
    
    ret = rep.ret;
    
    UnlockDisplay(dpy);
    SyncHandle();
    
    return ret;
}